

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend.cpp
# Opt level: O2

ggml_backend_buffer_t ggml_backend_alloc_buffer(ggml_backend_t backend,size_t size)

{
  ggml_backend_buffer_type_t buft;
  ggml_backend_buffer_t pgVar1;
  
  buft = (*(backend->device->iface).get_buffer_type)(backend->device);
  pgVar1 = ggml_backend_buft_alloc_buffer(buft,size);
  return pgVar1;
}

Assistant:

ggml_backend_buffer_t ggml_backend_alloc_buffer(ggml_backend_t backend, size_t size) {
    return ggml_backend_buft_alloc_buffer(ggml_backend_get_default_buffer_type(backend), size);
}